

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_zstd.c
# Opt level: O1

void test_write_filter_zstd(void)

{
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  void *__s;
  archive *paVar4;
  char *pcVar5;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  ulong uVar8;
  uint uVar9;
  archive_entry *ae;
  size_t used1;
  size_t used3;
  size_t used2;
  char path [16];
  archive_entry *local_78;
  void *local_70;
  uint local_68;
  undefined4 uStack_64;
  void *local_60;
  uint local_58;
  undefined4 uStack_54;
  uint local_50;
  undefined4 uStack_4c;
  char local_48 [24];
  
  pvVar3 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                   ,L'(',(uint)(pvVar3 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  if (pvVar3 != (void *)0x0) {
    __s = malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                     ,L'-',(uint)(__s != (void *)0x0),"NULL != (data = malloc(datasize))",
                     (void *)0x0);
    if (__s != (void *)0x0) {
      memset(__s,0,10000);
      paVar4 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'7',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar4);
      iVar1 = archive_write_add_filter_zstd(paVar4);
      if (iVar1 == 0) {
        iVar1 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'B',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar1 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'C',0xe,"ARCHIVE_FILTER_ZSTD",(long)iVar1,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        local_60 = __s;
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                   ,L'D',"zstd","\"zstd\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        local_70 = pvVar3;
        iVar1 = archive_write_open_memory(paVar4,pvVar3,2000000,(size_t *)&local_68);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'E',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
        iVar1 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'F',0xe,"ARCHIVE_FILTER_ZSTD",(long)iVar1,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                   ,L'G',"zstd","\"zstd\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        local_78 = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'H',(uint)(local_78 != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype(local_78,0x8000);
        archive_entry_set_size(local_78,10000);
        uVar8 = 0;
        do {
          snprintf(local_48,0x10,"file%03d",uVar8);
          archive_entry_copy_pathname(local_78,local_48);
          iVar1 = archive_write_header(paVar4,local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'N',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4)
          ;
          lVar6 = archive_write_data(paVar4,local_60,10000);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'P',(uint)(lVar6 == 10000),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar9;
        } while (uVar9 != 100);
        archive_entry_free(local_78);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'S',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'T',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'V',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            paVar4);
        iVar1 = archive_read_support_filter_zstd(paVar4);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Z');
          test_skipping(
                       "Can\'t verify zstd writing by reading back; zstd reading not fully supported on this platform"
                       );
        }
        else {
          iVar1 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                              paVar4);
          iVar1 = archive_read_open_memory(paVar4,local_70,CONCAT44(uStack_64,local_68));
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'`',0,"ARCHIVE_OK",(long)iVar1,
                              "archive_read_open_memory(a, buff, used1)",paVar4);
          uVar8 = 0;
          do {
            snprintf(local_48,0x10,"file%03d",uVar8);
            iVar1 = archive_read_next_header(paVar4,&local_78);
            wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                        ,L'd',0,"ARCHIVE_OK",(long)iVar1,
                                        "archive_read_next_header(a, &ae)",(void *)0x0);
            if (wVar2 == L'\0') break;
            pcVar5 = archive_entry_pathname(local_78);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'f',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
            lVar7 = archive_entry_size(local_78);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                ,L'g',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
            uVar9 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar9;
          } while (uVar9 != 100);
          iVar1 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'i',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
        }
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'q',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L't',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar1 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'u',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"nonexistent-option","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'w',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"nonexistent-option\", \"0\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","abc");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'y',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","25");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'{',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"25\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","9");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'}',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","7");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"7\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"threads","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x84',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"threads\", \"-1\")",paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"threads","4");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"threads\", \"4\")",paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"frame-per-file","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x8a',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"frame-per-file\", \"\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x8d',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x8f',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"-1\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x91',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"0\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x93',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1048576\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1k\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x97',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1kB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x99',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1M\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1MB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x9d',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1G\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x9f',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1GB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¢',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¤',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"-1\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¦',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"0\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¨',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1048576\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ª',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1k\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¬',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1kB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'®',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1M\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'°',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1MB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'²',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1G\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'´',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1GB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'·',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¹',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"-1\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'»',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"0\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1023");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'½',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1023\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1024");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¿',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1024\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Á',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1048576\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1k\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Å',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1kB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ç',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1M\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'É',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1MB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ë',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1G\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Í',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1GB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ð',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ò',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"-1\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ô',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"0\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1023");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ö',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1023\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1024");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ø',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1024\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1048576\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ü',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1k\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Þ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1kB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'à',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1M\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'â',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1MB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ä',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1G\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'æ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1GB\")",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"long","23");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ê',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"long\", \"23\")",paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"long","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ì',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"long\", \"-1\")",paVar4);
        iVar1 = archive_write_open_memory(paVar4,local_70,2000000,(size_t *)&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'î',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        pvVar3 = local_60;
        uVar8 = 0;
        do {
          snprintf(local_48,0x10,"file%03d",uVar8);
          local_78 = archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'ñ',(uint)(local_78 != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname(local_78,local_48);
          archive_entry_set_size(local_78,10000);
          archive_entry_set_filetype(local_78,0x8000);
          iVar1 = archive_write_header(paVar4,local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'õ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4
                             );
          lVar6 = archive_write_data(paVar4,pvVar3,10000);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'ö',(uint)(lVar6 == 10000),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
          archive_entry_free(local_78);
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar9;
        } while (uVar9 != 100);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ù',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ú',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ü',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ý',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            paVar4);
        iVar1 = archive_read_support_filter_zstd(paVar4);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ā');
          test_skipping("zstd reading not fully supported on this platform");
        }
        else {
          iVar1 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ă',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)"
                              ,paVar4);
          iVar1 = archive_read_open_memory(paVar4,local_70,CONCAT44(uStack_4c,local_50));
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ą',0,"ARCHIVE_OK",(long)iVar1,
                              "archive_read_open_memory(a, buff, used2)",paVar4);
          uVar8 = 0;
          do {
            snprintf(local_48,0x10,"file%03d",uVar8);
            failure("Trying to read %s",local_48);
            iVar1 = archive_read_next_header(paVar4,&local_78);
            wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                        ,L'Ċ',0,"ARCHIVE_OK",(long)iVar1,
                                        "archive_read_next_header(a, &ae)",paVar4);
            if (wVar2 == L'\0') break;
            pcVar5 = archive_entry_pathname(local_78);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'Č',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
            ;
            lVar7 = archive_entry_size(local_78);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                ,L'č',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
            uVar9 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar9;
          } while (uVar9 != 100);
          iVar1 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ď',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
        }
        pvVar3 = local_70;
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'đ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ė',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ė',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ę',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar1 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ě',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ĝ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")"
                            ,paVar4);
        iVar1 = archive_write_open_memory(paVar4,pvVar3,2000000,(size_t *)&local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ĝ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used3)",paVar4);
        local_78 = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ğ',(uint)(local_78 != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype(local_78,0x8000);
        archive_entry_set_size(local_78,10000);
        pvVar3 = local_60;
        uVar8 = 0;
        do {
          snprintf(local_48,0x10,"file%03d",uVar8);
          archive_entry_copy_pathname(local_78,local_48);
          iVar1 = archive_write_header(paVar4,local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'Ĥ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4
                             );
          lVar6 = archive_write_data(paVar4,pvVar3,10000);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'ĥ',(uint)(lVar6 == 10000),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar9;
        } while (uVar9 != 100);
        archive_entry_free(local_78);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ĩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ĩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ī',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            paVar4);
        iVar1 = archive_read_support_filter_zstd(paVar4);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'į');
          test_skipping("zstd reading not fully supported on this platform");
        }
        else {
          iVar1 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'Ĳ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)"
                              ,paVar4);
          iVar1 = archive_read_open_memory(paVar4,local_70,CONCAT44(uStack_54,local_58));
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'Ĵ',0,"ARCHIVE_OK",(long)iVar1,
                              "archive_read_open_memory(a, buff, used3)",paVar4);
          uVar8 = 0;
          do {
            snprintf(local_48,0x10,"file%03d",uVar8);
            failure("Trying to read %s",local_48);
            iVar1 = archive_read_next_header(paVar4,&local_78);
            wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                        ,L'Ĺ',0,"ARCHIVE_OK",(long)iVar1,
                                        "archive_read_next_header(a, &ae)",paVar4);
            if (wVar2 == L'\0') break;
            pcVar5 = archive_entry_pathname(local_78);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'Ļ',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
            ;
            lVar7 = archive_entry_size(local_78);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                ,L'ļ',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
            uVar9 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar9;
          } while (uVar9 != 100);
          iVar1 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ľ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
        }
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ŀ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        failure("compression-level=7 wrote %d bytes, default wrote %d bytes",(ulong)local_50,
                (ulong)local_68);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ň',(uint)(CONCAT44(uStack_4c,local_50) < CONCAT44(uStack_64,local_68)),
                         "used2 < used1",(void *)0x0);
        failure("compression-level=1 wrote %d bytes, default wrote %d bytes",(ulong)local_58,
                (ulong)local_68);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ŋ',(uint)(CONCAT44(uStack_64,local_68) < CONCAT44(uStack_54,local_58)),
                         "used1 < used3",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ő',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Œ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'œ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ŕ',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ŗ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ŗ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ř',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ś',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ś',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ŝ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ŝ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ş',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Š',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'š',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ţ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_zstd(a)",
                            paVar4);
        __s = local_70;
        iVar1 = archive_write_open_memory(paVar4,local_70,2000000,(size_t *)&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ţ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ť',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        wVar2 = L'ť';
        pvVar3 = local_60;
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L';');
        test_skipping("zstd writing not supported on this platform");
        wVar2 = L'<';
      }
      iVar1 = archive_write_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                          ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(pvVar3);
      pvVar3 = __s;
    }
    free(pvVar3);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_zstd)
{
	struct archive_entry *ae;
	struct archive *a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2, used3;
	int i, r;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_zstd(a);
	if (r != ARCHIVE_OK) {
		skipping("zstd writing not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_ZSTD, archive_filter_code(a, 0));
	assertEqualString("zstd", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used1));
	assertEqualInt(ARCHIVE_FILTER_ZSTD, archive_filter_code(a, 0));
	assertEqualString("zstd", archive_filter_name(a, 0));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_zstd(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify zstd writing by reading back;"
		    " zstd reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "25")); /* too big */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	/* Following is disabled as it will fail on library versions < 1.3.4 */
	/* assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "-1")); */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "7"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "threads", "-1")); /* negative */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "threads", "4"));
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream
	/* frame-per-file: boolean */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "frame-per-file", ""));
	/* min-frame-in: >= 0 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "-1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1GB"));
	/* min-frame-out: >= 0 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "-1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1GB"));
	/* max-frame-in: >= 1024 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "-1"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1023"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1024"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1GB"));
	/* max-frame-out: >= 1024 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "-1"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1023"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1024"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1GB"));
#endif
#if ZSTD_VERSION_NUMBER >= MINVER_LONG
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "long", "23"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "long", "-1")); /* negative */
#endif
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_zstd(a);
	if (r == ARCHIVE_WARN) {
		skipping("zstd reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			failure("Trying to read %s", path);
			if (!assertEqualIntA(a, ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * One more time at level 1
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used3));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_zstd(a);
	if (r == ARCHIVE_WARN) {
		skipping("zstd reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used3));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			failure("Trying to read %s", path);
			if (!assertEqualIntA(a, ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Check output sizes for various compression levels, expectation
	 * is that archive size for level=7 < default < level=1
	 */
	failure("compression-level=7 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	failure("compression-level=1 wrote %d bytes, default wrote %d bytes",
	    (int)used3, (int)used1);
	assert(used1 < used3);

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}